

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::Tex2DShader::shadeFragments
          (Tex2DShader *this,FragmentPacket *packets,int numPackets,FragmentShadingContext *context)

{
  int iVar1;
  GenericVec4 *pGVar2;
  int iVar3;
  int fragNdx;
  long lVar4;
  ulong uVar5;
  int iVar6;
  Vec4 colors [4];
  Vec2 texCoords [4];
  Vec4 coord;
  Vec4 local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  Vec2 local_68 [5];
  undefined8 local_40 [2];
  
  local_68[2].m_data[0] = 0.0;
  local_68[2].m_data[1] = 0.0;
  local_68[3].m_data[0] = 0.0;
  local_68[3].m_data[1] = 0.0;
  local_68[0].m_data[0] = 0.0;
  local_68[0].m_data[1] = 0.0;
  local_68[1].m_data[0] = 0.0;
  local_68[1].m_data[1] = 0.0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8.m_data[0] = 0.0;
  local_a8.m_data[1] = 0.0;
  local_a8.m_data[2] = 0.0;
  local_a8.m_data[3] = 0.0;
  if (0 < numPackets) {
    iVar6 = 0;
    uVar5 = 0;
    do {
      lVar4 = 0;
      do {
        rr::readTriangleVarying<float>((rr *)local_40,packets + uVar5,context,0,(int)lVar4);
        *(undefined8 *)local_68[lVar4].m_data = local_40[0];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      sglr::rc::Texture2D::sample4
                ((((this->super_ShaderProgram).m_uniforms.
                   super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl
                   .super__Vector_impl_data._M_start)->sampler).tex2D,&local_a8,local_68,0.0);
      pGVar2 = context->outputArray;
      iVar1 = context->numFragmentOutputs;
      iVar3 = iVar1 * iVar6;
      lVar4 = 0;
      do {
        pGVar2[iVar3].v.uData[0] = *(deUint32 *)((long)local_a8.m_data + lVar4);
        pGVar2[iVar3].v.uData[1] = *(deUint32 *)((long)local_a8.m_data + lVar4 + 4);
        pGVar2[iVar3].v.uData[2] = *(deUint32 *)((long)local_a8.m_data + lVar4 + 8);
        pGVar2[iVar3].v.uData[3] = *(deUint32 *)((long)local_a8.m_data + lVar4 + 0xc);
        lVar4 = lVar4 + 0x10;
        iVar3 = iVar3 + iVar1;
      } while (lVar4 != 0x40);
      uVar5 = uVar5 + 1;
      iVar6 = iVar6 + 4;
    } while (uVar5 != (uint)numPackets);
  }
  return;
}

Assistant:

void shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
	{
		tcu::Vec2 texCoords[4];
		tcu::Vec4 colors[4];

		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		{
			// setup tex coords
			for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			{
				const tcu::Vec4	coord = rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx);
				texCoords[fragNdx] = tcu::Vec2(coord.x(), coord.y());
			}

			// Sample
			m_uniforms[0].sampler.tex2D->sample4(colors, texCoords);

			// Write out
			for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
				rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, colors[fragNdx]);
		}
	}